

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.hpp
# Opt level: O2

double __thiscall
SimpleConfiguration::polyFunc
          (SimpleConfiguration *this,double x,int order,vector<double,_std::allocator<double>_> *a)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  dVar3 = 1.0;
  for (lVar1 = 0; lVar1 <= order; lVar1 = lVar1 + 1) {
    dVar2 = dVar2 + (a->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar1] * dVar3;
    dVar3 = dVar3 * x;
  }
  return dVar2;
}

Assistant:

double polyFunc(double x, int order, vector<double> &a) {
        double base = 1.0;
        double res = 0.0;
        for (int i = 0; i <= order; ++i) {
            res += a[i] * base;
            base *= x;
        }
        return res;
    }